

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O1

double luby(double y,int x)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  
  if (x < 1) {
    iVar3 = 0;
    iVar2 = 0;
  }
  else {
    iVar1 = 1;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + 1;
      iVar3 = iVar1 * 2;
      iVar1 = iVar1 * 2 + 1;
    } while (iVar3 < x);
  }
  for (; iVar3 != x; iVar3 = (iVar3 >> 1) + -1) {
    iVar2 = iVar2 + -1;
    x = x % (iVar3 >> 1);
  }
  dVar4 = pow(y,(double)iVar2);
  return dVar4;
}

Assistant:

double luby(double y, int x)
{
    int size, seq;
    for (size = 1, seq = 0; size < x+1; seq++, size = 2*size + 1);
    while (size-1 != x){
        size = (size-1) >> 1;
        seq--;
        x = x % size;
    }
    return pow(y, (double)seq);
}